

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  ushort *puVar10;
  ushort *puVar11;
  ushort *__src;
  ulong uVar12;
  ulong uVar13;
  size_t dictSize_00;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  BYTE *d_2;
  BYTE *d_3;
  long lVar22;
  ulong uVar23;
  BYTE *s;
  int local_68;
  
  if (dictSize == 0) {
    iVar9 = LZ4_decompress_safe_partial(source,dest,compressedSize,targetOutputSize,dstCapacity);
    return iVar9;
  }
  dictSize_00 = (size_t)dictSize;
  if (dictStart + dictSize_00 == dest) {
    uVar13 = (ulong)(uint)dstCapacity;
    if (targetOutputSize < dstCapacity) {
      uVar13 = (ulong)(uint)targetOutputSize;
    }
    iVar9 = (int)uVar13;
    iVar21 = (int)dest;
    if (dictSize < 0xffff) {
      if (iVar9 < 0 || source == (char *)0x0) {
        return -1;
      }
      if (iVar9 != 0) {
        if (compressedSize == 0) {
          return -1;
        }
        pcVar18 = dest + -dictSize_00;
        pbVar1 = (byte *)(source + compressedSize);
        pcVar2 = dest + uVar13;
        pcVar17 = dest + (uVar13 - 0x20);
        puVar11 = (ushort *)source;
LAB_0011be33:
        do {
          __src = (ushort *)((long)puVar11 + 1);
          bVar3 = (byte)*puVar11;
          uVar13 = (ulong)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) {
            if (pbVar1 + -0xf <= __src) goto LAB_0011c1a1;
            puVar11 = puVar11 + 1;
            lVar22 = 0;
            puVar10 = __src;
            do {
              __src = (ushort *)((long)puVar10 + 1);
              if (pbVar1 + -0xf < __src) goto LAB_0011c1a1;
              uVar7 = *puVar10;
              lVar22 = lVar22 + (ulong)(byte)uVar7;
              puVar11 = (ushort *)((long)puVar11 + 1);
              puVar10 = __src;
            } while ((ulong)(byte)uVar7 == 0xff);
            if (((lVar22 == -1) || (uVar13 = lVar22 + 0xf, CARRY8((ulong)dest,uVar13))) ||
               ((ulong)-(long)puVar11 < uVar13)) goto LAB_0011c1a1;
LAB_0011bea4:
            pcVar15 = dest + uVar13;
            if ((pcVar2 + -0xc < pcVar15) ||
               (puVar11 = (ushort *)((long)__src + uVar13), pbVar1 + -8 < puVar11)) {
              pcVar16 = pcVar15;
              if (pbVar1 < (byte *)((long)__src + uVar13)) {
                pcVar16 = dest + ((long)pbVar1 - (long)__src);
              }
              if (pcVar2 < pcVar16) {
                memmove(dest,__src,(long)pcVar2 - (long)dest);
                pcVar15 = pcVar2;
              }
              else {
                if (pbVar1 < (byte *)((long)__src + uVar13)) {
                  uVar13 = (long)pbVar1 - (long)__src;
                }
                memmove(dest,__src,uVar13);
                pcVar15 = dest + uVar13;
                if ((pcVar16 != pcVar2) &&
                   (puVar11 = (ushort *)((long)__src + uVar13), puVar11 < pbVar1 + -2))
                goto LAB_0011bf3a;
              }
              iVar9 = (int)pcVar15;
              goto LAB_0011c199;
            }
            do {
              *(undefined8 *)dest = *(undefined8 *)__src;
              dest = dest + 8;
              __src = __src + 4;
            } while (dest < pcVar15);
LAB_0011bf3a:
            uVar7 = *puVar11;
            __src = puVar11 + 1;
            pcVar16 = pcVar15 + -(ulong)uVar7;
            uVar20 = (ulong)(bVar3 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src) || (pcVar17 < dest))
            goto LAB_0011bea4;
            uVar6 = *(undefined8 *)((long)puVar11 + 9);
            *(undefined8 *)dest = *(undefined8 *)__src;
            *(undefined8 *)(dest + 8) = uVar6;
            pcVar15 = dest + uVar13;
            uVar20 = (ulong)(bVar3 & 0xf);
            puVar11 = (ushort *)((long)__src + uVar13);
            __src = puVar11 + 1;
            uVar7 = *puVar11;
            pcVar16 = pcVar15 + -(ulong)uVar7;
            if ((uVar20 != 0xf) && ((7 < uVar7 && (pcVar18 <= pcVar16)))) {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar16;
              *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)(pcVar16 + 8);
              *(undefined2 *)(pcVar15 + 0x10) = *(undefined2 *)(pcVar16 + 0x10);
              dest = pcVar15 + uVar20 + 4;
              puVar11 = __src;
              goto LAB_0011be33;
            }
          }
          if ((int)uVar20 == 0xf) {
            lVar22 = 0;
            puVar11 = __src;
            do {
              __src = (ushort *)((long)puVar11 + 1);
              if (pbVar1 + -4 < __src) goto LAB_0011c1a1;
              uVar8 = *puVar11;
              lVar22 = lVar22 + (ulong)(byte)uVar8;
              puVar11 = __src;
            } while ((ulong)(byte)uVar8 == 0xff);
            uVar20 = lVar22 + 0xf;
            if ((lVar22 == -1) || (CARRY8((ulong)pcVar15,uVar20))) goto LAB_0011c1a1;
          }
          if (pcVar16 < pcVar18) goto LAB_0011c1a1;
          uVar20 = uVar20 + 4;
          dest = pcVar15 + uVar20;
          puVar11 = __src;
          if (pcVar2 + -0xc < dest) {
            uVar13 = (long)pcVar2 - (long)pcVar15;
            if (uVar20 < (ulong)((long)pcVar2 - (long)pcVar15)) {
              uVar13 = uVar20;
            }
            dest = pcVar15 + uVar13;
            if (pcVar15 < pcVar16 + uVar13) {
              if (0 < (long)uVar13) {
                do {
                  cVar4 = *pcVar16;
                  pcVar16 = pcVar16 + 1;
                  *pcVar15 = cVar4;
                  pcVar15 = pcVar15 + 1;
                } while (pcVar15 < dest);
              }
            }
            else {
              memcpy(pcVar15,pcVar16,uVar13);
            }
            if (dest == pcVar2) {
              iVar9 = (int)pcVar2;
LAB_0011c199:
              return iVar9 - iVar21;
            }
          }
          else {
            if (uVar7 < 8) {
              pcVar15[0] = '\0';
              pcVar15[1] = '\0';
              pcVar15[2] = '\0';
              pcVar15[3] = '\0';
              *pcVar15 = *pcVar16;
              pcVar15[1] = pcVar16[1];
              pcVar15[2] = pcVar16[2];
              pcVar15[3] = pcVar16[3];
              uVar5 = inc32table[uVar7];
              *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar16 + uVar5);
              pcVar16 = pcVar16 + ((ulong)uVar5 - (long)dec64table[uVar7]);
            }
            else {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar16;
              pcVar16 = pcVar16 + 8;
            }
            *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)pcVar16;
            if (0x10 < uVar20) {
              pcVar15 = pcVar15 + 0x10;
              do {
                pcVar16 = pcVar16 + 8;
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar16;
                pcVar15 = pcVar15 + 8;
              } while (pcVar15 < dest);
            }
          }
        } while( true );
      }
    }
    else {
      if (iVar9 < 0 || source == (char *)0x0) {
        return -1;
      }
      if (iVar9 != 0) {
        if (compressedSize == 0) {
          return -1;
        }
        pbVar1 = (byte *)(source + compressedSize);
        pcVar2 = dest + uVar13;
        uVar20 = 0;
        puVar11 = (ushort *)source;
LAB_0011ba91:
        do {
          pcVar17 = dest + uVar20;
          __src = (ushort *)((long)puVar11 + 1);
          bVar3 = (byte)*puVar11;
          uVar23 = (ulong)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) {
            if (pbVar1 + -0xf <= __src) {
LAB_0011c1a1:
              local_68 = (int)source;
              return ~(uint)__src + local_68;
            }
            puVar11 = puVar11 + 1;
            lVar22 = 0;
            puVar10 = __src;
            do {
              __src = (ushort *)((long)puVar10 + 1);
              if (pbVar1 + -0xf < __src) goto LAB_0011c1a1;
              uVar7 = *puVar10;
              lVar22 = lVar22 + (ulong)(byte)uVar7;
              puVar11 = (ushort *)((long)puVar11 + 1);
              puVar10 = __src;
            } while ((ulong)(byte)uVar7 == 0xff);
            if (((lVar22 == -1) || (uVar23 = lVar22 + 0xf, CARRY8((ulong)pcVar17,uVar23))) ||
               ((ulong)-(long)puVar11 < uVar23)) goto LAB_0011c1a1;
LAB_0011bb09:
            lVar22 = uVar20 + uVar23;
            pcVar18 = dest + lVar22;
            if ((pcVar2 + -0xc < pcVar18) ||
               (puVar11 = (ushort *)((long)__src + uVar23), pbVar1 + -8 < puVar11)) {
              if (pbVar1 < (byte *)((long)__src + uVar23)) {
                pcVar18 = pcVar17 + ((long)pbVar1 - (long)__src);
              }
              if (pcVar2 < pcVar18) {
                memmove(pcVar17,__src,uVar13 - uVar20);
                pcVar17 = pcVar2;
                goto LAB_0011c184;
              }
              if (pbVar1 < (byte *)((long)__src + uVar23)) {
                uVar23 = (long)pbVar1 - (long)__src;
              }
              memmove(pcVar17,__src,uVar23);
              lVar22 = uVar20 + uVar23;
              if ((pcVar18 == pcVar2) ||
                 (puVar11 = (ushort *)((long)__src + uVar23), pbVar1 + -2 <= puVar11)) {
                pcVar17 = dest + lVar22;
                goto LAB_0011c184;
              }
            }
            else {
              do {
                *(undefined8 *)pcVar17 = *(undefined8 *)__src;
                pcVar17 = pcVar17 + 8;
                __src = __src + 4;
              } while (pcVar17 < pcVar18);
            }
            uVar7 = *puVar11;
            __src = puVar11 + 1;
            lVar14 = lVar22 - (ulong)uVar7;
            uVar12 = (ulong)(bVar3 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src) ||
               (dest + (uVar13 - 0x20) < pcVar17)) goto LAB_0011bb09;
            uVar6 = *(undefined8 *)((long)puVar11 + 9);
            *(undefined8 *)pcVar17 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar17 + 8) = uVar6;
            lVar22 = uVar20 + uVar23;
            uVar12 = (ulong)(bVar3 & 0xf);
            puVar11 = (ushort *)((long)__src + uVar23);
            __src = puVar11 + 1;
            uVar7 = *puVar11;
            lVar14 = lVar22 - (ulong)uVar7;
            if (7 < uVar7 && uVar12 != 0xf) {
              *(undefined8 *)(dest + lVar22) = *(undefined8 *)(dest + lVar14);
              *(undefined8 *)(dest + lVar22 + 8) = *(undefined8 *)(dest + lVar14 + 8);
              *(undefined2 *)(dest + lVar22 + 0x10) = *(undefined2 *)(dest + lVar14 + 0x10);
              uVar20 = lVar22 + uVar12 + 4;
              puVar11 = __src;
              goto LAB_0011ba91;
            }
          }
          pcVar18 = dest + lVar22;
          if ((int)uVar12 == 0xf) {
            lVar19 = 0;
            puVar11 = __src;
            do {
              __src = (ushort *)((long)puVar11 + 1);
              if (pbVar1 + -4 < __src) goto LAB_0011c1a1;
              uVar8 = *puVar11;
              lVar19 = lVar19 + (ulong)(byte)uVar8;
              puVar11 = __src;
            } while ((ulong)(byte)uVar8 == 0xff);
            uVar12 = lVar19 + 0xf;
            if ((lVar19 == -1) || (CARRY8((ulong)pcVar18,uVar12))) goto LAB_0011c1a1;
          }
          if (lVar14 < -0x10000) goto LAB_0011c1a1;
          pcVar15 = dest + lVar14;
          uVar12 = uVar12 + 4;
          uVar20 = lVar22 + uVar12;
          puVar11 = __src;
          if (pcVar2 + -0xc < dest + uVar20) {
            uVar23 = uVar13 - lVar22;
            if (uVar12 < uVar13 - lVar22) {
              uVar23 = uVar12;
            }
            uVar20 = lVar22 + uVar23;
            pcVar17 = dest + uVar20;
            if (pcVar18 < pcVar15 + uVar23) {
              if (0 < (long)uVar23) {
                do {
                  cVar4 = *pcVar15;
                  pcVar15 = pcVar15 + 1;
                  *pcVar18 = cVar4;
                  pcVar18 = pcVar18 + 1;
                } while (pcVar18 < pcVar17);
              }
            }
            else {
              memcpy(pcVar18,pcVar15,uVar23);
            }
            if (uVar20 == uVar13) {
LAB_0011c184:
              return (int)pcVar17 - iVar21;
            }
          }
          else {
            if (uVar7 < 8) {
              pcVar18[0] = '\0';
              pcVar18[1] = '\0';
              pcVar18[2] = '\0';
              pcVar18[3] = '\0';
              *pcVar18 = *pcVar15;
              pcVar18[1] = pcVar15[1];
              pcVar18[2] = pcVar15[2];
              pcVar18[3] = pcVar15[3];
              uVar5 = inc32table[uVar7];
              *(undefined4 *)(pcVar18 + 4) = *(undefined4 *)(pcVar15 + uVar5);
              pcVar15 = pcVar15 + ((ulong)uVar5 - (long)dec64table[uVar7]);
            }
            else {
              *(undefined8 *)pcVar18 = *(undefined8 *)pcVar15;
              pcVar15 = pcVar15 + 8;
            }
            *(undefined8 *)(pcVar18 + 8) = *(undefined8 *)pcVar15;
            if (0x10 < uVar12) {
              pcVar18 = pcVar18 + 0x10;
              do {
                pcVar15 = pcVar15 + 8;
                *(undefined8 *)pcVar18 = *(undefined8 *)pcVar15;
                pcVar18 = pcVar18 + 8;
              } while (pcVar18 < dest + uVar20);
            }
          }
        } while( true );
      }
    }
    iVar9 = 0;
  }
  else {
    iVar9 = LZ4_decompress_safe_partial_forceExtDict
                      (source,dest,compressedSize,targetOutputSize,dstCapacity,dictStart,dictSize_00
                      );
  }
  return iVar9;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}